

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void uint256_tests::from_user_hex_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  from_user_hex t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff628;
  std_string *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff638;
  const_string *in_stack_fffffffffffff650;
  const_string *msg;
  size_t in_stack_fffffffffffff658;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff660;
  unit_test_log_t *in_stack_fffffffffffff668;
  from_user_hex local_822;
  undefined1 local_821;
  undefined1 local_800 [408];
  undefined1 local_668 [408];
  undefined1 local_4d0 [408];
  undefined1 local_338 [408];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  local_821 = 0x22;
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [14])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [15])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [14])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [16])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::setup_conditional<uint256_tests::from_user_hex>((from_user_hex *)0xbeffbf);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_4d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [14])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [13])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  from_user_hex::test_method(&local_822);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [14])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [19])in_stack_fffffffffffff630);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::teardown_conditional<uint256_tests::from_user_hex>((from_user_hex *)0xbf01dc);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  file = boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [14])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [15])in_stack_fffffffffffff630);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(from_user_hex)
{
    BOOST_CHECK_EQUAL(uint256::FromUserHex(""), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("00"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("1"), uint256::ONE);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0xFf"), uint256{0xff});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("Ff"), uint256{0xff});
    const std::string valid_hex_64{"0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF"};
    BOOST_REQUIRE_EQUAL(valid_hex_64.size(), 2 + 64); // 0x prefix and 64 hex digits
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString(), ToLower(valid_hex_64.substr(2)));
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString(), ToLower(valid_hex_64.substr(2)));

    BOOST_CHECK(!uint256::FromUserHex("0x0 "));                       // no spaces at end,
    BOOST_CHECK(!uint256::FromUserHex(" 0x0"));                       // or beginning,
    BOOST_CHECK(!uint256::FromUserHex("0x 0"));                       // or middle,
    BOOST_CHECK(!uint256::FromUserHex(" "));                          // etc.
    BOOST_CHECK(!uint256::FromUserHex("0x0ga"));                      // invalid character
    BOOST_CHECK(!uint256::FromUserHex("x0"));                         // broken prefix
    BOOST_CHECK(!uint256::FromUserHex("0x0x00"));                     // two prefixes not allowed
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64.substr(2) + "0")); // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "a"));           // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + " "));           // whitespace after max length
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "z"));           // invalid character after max length
}